

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

JSONNode * JSONNode::newJSONNode(internalJSONNode *internal_t)

{
  JSONNode *this;
  
  this = (JSONNode *)operator_new(8);
  JSONNode(this,internal_t);
  return this;
}

Assistant:

JSONNode * JSONNode::newJSONNode(internalJSONNode * internal_t) {
	#ifdef JSON_MEMORY_POOL
		return new((JSONNode*)json_node_mempool.allocate()) JSONNode(internal_t);
	#elif defined(JSON_MEMORY_CALLBACKS)
		return new(json_malloc<JSONNode>(1)) JSONNode(internal_t);
	#else
		return new JSONNode(internal_t);
	#endif
}